

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O1

void __thiscall DyndepParserTestBuildEOF::~DyndepParserTestBuildEOF(DyndepParserTestBuildEOF *this)

{
  DyndepParserTest::~DyndepParserTest(&this->super_DyndepParserTest);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(DyndepParserTest, BuildEOF) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build out: dyndep";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: unexpected EOF\n"
            "build out: dyndep\n"
            "                 ^ near here", err);
}